

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

bool QOpenGLTexture::hasFeature(Feature feature)

{
  char cVar1;
  undefined1 uVar2;
  bool bVar3;
  QByteArray *pQVar4;
  undefined8 uVar5;
  long *plVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QSurfaceFormat f;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char> local_98;
  pair<int,_int> local_80;
  pair<int,_int> local_78;
  QArrayDataPointer<char> local_70;
  undefined1 *local_58;
  QArrayDataPointer<char> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QByteArray *)QOpenGLContext::currentContext();
  if (pQVar4 == (QByteArray *)0x0) {
    local_50.d._0_4_ = 2;
    local_50.size._4_4_ = 0;
    local_50.d._4_4_ = 0;
    local_50.ptr._0_4_ = 0;
    local_50.ptr._4_4_ = 0;
    local_50.size._0_4_ = 0;
    local_38 = "default";
    uVar2 = 0;
    QMessageLogger::warning
              ((char *)&local_50,"QOpenGLTexture::hasFeature() requires a valid current context");
    goto LAB_0014ffe9;
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  cVar1 = QOpenGLContext::isOpenGLES();
  uVar2 = 0;
  if (cVar1 == '\0') {
    uVar2 = 0;
    switch(feature) {
    case ImmutableStorage:
      local_78 = (pair<int,_int>)QSurfaceFormat::version();
      local_80.first = 4;
      local_80.second = 2;
      bVar3 = std::operator>=(&local_78,&local_80);
      uVar2 = 1;
      if (!bVar3) {
        local_50.d._0_4_ = 0;
        local_50.d._4_4_ = 0;
        local_70.d = (Data *)0x0;
        local_70.ptr = (char *)0x0;
        local_50.ptr._0_4_ = 0x17c3ae;
        local_50.ptr._4_4_ = 0;
        local_70.size = 0;
        local_50.size._0_4_ = 0x16;
        local_50.size._4_4_ = 0;
        cVar1 = QOpenGLContext::hasExtension(pQVar4);
        uVar2 = 1;
        if (cVar1 == '\0') {
          local_98.ptr = "GL_EXT_texture_storage";
          local_98.size = 0x16;
LAB_0014fad4:
          local_98.d = (Data *)0x0;
          local_b0.size = 0;
          local_b0.ptr = (char *)0x0;
          local_b0.d = (Data *)0x0;
          uVar2 = QOpenGLContext::hasExtension(pQVar4);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
        }
LAB_0014ffb4:
        QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
LAB_0014fc58:
        QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
      }
      break;
    case ImmutableMultisampleStorage:
      local_98.d = (Data *)QSurfaceFormat::version();
      local_b0.d = (Data *)0x300000004;
      bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
      uVar2 = 1;
      if (!bVar3) {
        local_50.ptr._0_4_ = 0x17c36e;
        local_50.size._0_4_ = 0x22;
LAB_0014fc40:
        local_50.ptr._4_4_ = 0;
        local_50.size._4_4_ = 0;
        local_50.d._4_4_ = 0;
        local_50.d._0_4_ = 0;
        local_70.size = 0;
        local_70.ptr = (char *)0x0;
        local_70.d = (Data *)0x0;
        uVar2 = QOpenGLContext::hasExtension(pQVar4);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
        goto LAB_0014fc58;
      }
      break;
    case ImmutableMultisampleStorage|ImmutableStorage:
    case TextureRectangle|ImmutableStorage:
    case TextureRectangle|ImmutableMultisampleStorage:
    case TextureRectangle|ImmutableMultisampleStorage|ImmutableStorage:
      break;
    case TextureRectangle:
      local_98.d = (Data *)QSurfaceFormat::version();
      local_b0.d = (Data *)0x100000002;
      bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
      uVar2 = 1;
      if (!bVar3) {
        local_50.ptr._0_4_ = 0x17cc5f;
        local_50.size._0_4_ = 0x15;
        goto LAB_0014fc40;
      }
      break;
    case TextureArrays:
      local_98.d = (Data *)QSurfaceFormat::version();
      local_b0.d = (Data *)0x3;
      bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
      uVar2 = 1;
      if (!bVar3) {
        local_50.ptr._0_4_ = 0x17c429;
        local_50.size._0_4_ = 0x14;
        goto LAB_0014fc40;
      }
      break;
    default:
      if (feature == Texture3D) {
        uVar5 = QSurfaceFormat::version();
        local_50.d._0_4_ = (undefined4)uVar5;
        local_50.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        local_70.d = (Data *)0x300000001;
        goto LAB_0014f9bb;
      }
      if (feature == TextureMultisample) {
        local_98.d = (Data *)QSurfaceFormat::version();
        local_b0.d = (Data *)0x200000003;
        bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
        uVar2 = 1;
        if (!bVar3) {
          local_50.ptr._0_4_ = 0x17c40e;
LAB_0014fbd3:
          local_50.size._0_4_ = 0x1a;
          goto LAB_0014fc40;
        }
      }
      else if (feature == TextureBuffer) {
        local_98.d = (Data *)QSurfaceFormat::version();
        local_b0.d = (Data *)0x3;
        bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
        uVar2 = 1;
        if (!bVar3) {
          local_50.ptr._0_4_ = 0x17c391;
          local_50.size._0_4_ = 0x1c;
          goto LAB_0014fc40;
        }
      }
      else {
        if (feature != TextureCubeMapArrays) {
          if (feature == Swizzle) {
            local_98.d = (Data *)QSurfaceFormat::version();
            local_b0.d = (Data *)0x300000003;
            bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
            uVar2 = 1;
            if (bVar3) break;
            local_50.ptr._0_4_ = 0x17c3f7;
            local_50.size._0_4_ = 0x16;
          }
          else if (feature == StencilTexturing) {
            local_98.d = (Data *)QSurfaceFormat::version();
            local_b0.d = (Data *)0x300000004;
            bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
            uVar2 = 1;
            if (bVar3) break;
            local_50.ptr._0_4_ = 0x17c651;
            local_50.size._0_4_ = 0x18;
          }
          else if (feature == AnisotropicFiltering) {
            local_50.ptr._0_4_ = 0x17c76d;
            local_50.size._0_4_ = 0x21;
          }
          else {
            if ((feature != NPOTTextures) && (feature != NPOTTextureRepeat)) {
              if (feature == Texture1D) {
                uVar5 = QSurfaceFormat::version();
                local_50.d._0_4_ = (undefined4)uVar5;
                local_50.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
                local_70.d = (Data *)0x100000001;
LAB_0014f9bb:
                uVar2 = std::operator>=((pair<int,_int> *)&local_50,(pair<int,_int> *)&local_70);
              }
              else if (feature == TextureComparisonOperators) {
                local_78 = (pair<int,_int>)QSurfaceFormat::version();
                local_80.first = 1;
                local_80.second = 5;
                bVar3 = std::operator>=(&local_78,&local_80);
                uVar2 = 1;
                if (!bVar3) {
                  local_50.d._0_4_ = 0;
                  local_50.d._4_4_ = 0;
                  local_70.d = (Data *)0x0;
                  local_70.ptr = (char *)0x0;
                  local_50.ptr._0_4_ = 0x17c45e;
                  local_50.ptr._4_4_ = 0;
                  local_70.size = 0;
                  local_50.size._0_4_ = 0xd;
                  local_50.size._4_4_ = 0;
                  cVar1 = QOpenGLContext::hasExtension(pQVar4);
                  if (cVar1 != '\0') {
                    local_98.ptr = "GL_EXT_shadow_funcs";
                    local_98.size = 0x13;
                    goto LAB_0014fad4;
                  }
                  uVar2 = 0;
                  goto LAB_0014ffb4;
                }
              }
              else {
                uVar2 = 0;
                if (feature == TextureMipMapLevel) {
                  uVar5 = QSurfaceFormat::version();
                  local_50.d._0_4_ = (undefined4)uVar5;
                  local_50.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
                  local_70.d = (Data *)0x200000001;
                  goto LAB_0014f9bb;
                }
              }
              break;
            }
            local_50.ptr._0_4_ = 0x17c43e;
            local_50.size._0_4_ = 0x1f;
          }
          goto LAB_0014fc40;
        }
        local_98.d = (Data *)QSurfaceFormat::version();
        local_b0.d = (Data *)0x4;
        bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
        uVar2 = 1;
        if (!bVar3) {
          local_50.ptr._0_4_ = 0x17c3dc;
          goto LAB_0014fbd3;
        }
      }
    }
  }
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 == '\0') goto LAB_0014ffdf;
  plVar6 = (long *)QOpenGLContext::functions();
  pcVar7 = (char *)(**(code **)(*plVar6 + 0xd0))(0x1f01);
  if (feature == TextureMipMapLevel) {
LAB_0014fd45:
    uVar5 = QSurfaceFormat::version();
    local_50.d._0_4_ = (undefined4)uVar5;
    local_50.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    local_70.d = (Data *)0x3;
LAB_0014fd89:
    uVar2 = std::operator>=((pair<int,_int> *)&local_50,(pair<int,_int> *)&local_70);
  }
  else {
    if (feature == ImmutableMultisampleStorage) {
LAB_0014fd65:
      uVar5 = QSurfaceFormat::version();
      local_50.d._0_4_ = (undefined4)uVar5;
      local_50.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_70.d = (Data *)0x100000003;
      goto LAB_0014fd89;
    }
    if (feature == TextureArrays) goto LAB_0014fd45;
    if (feature == Texture3D) {
      local_98.d = (Data *)QSurfaceFormat::version();
      local_b0.d = (Data *)0x3;
      bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
      uVar2 = 1;
      if (bVar3) goto LAB_0014ffdf;
      local_50.ptr._0_4_ = 0x17c485;
      local_50.size._0_4_ = 0x11;
LAB_0014ff39:
      local_50.size._4_4_ = 0;
      local_50.ptr._4_4_ = 0;
      local_50.d._4_4_ = 0;
      local_50.d._0_4_ = 0;
      local_70.size = 0;
      local_70.ptr = (char *)0x0;
      local_70.d = (Data *)0x0;
      uVar2 = QOpenGLContext::hasExtension(pQVar4);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
LAB_0014ffda:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    }
    else {
      if (feature == TextureMultisample) goto LAB_0014fd65;
      if (feature == Swizzle) goto LAB_0014fd45;
      if (feature == AnisotropicFiltering) {
        local_50.ptr._0_4_ = 0x17c76d;
        local_50.size._0_4_ = 0x21;
        goto LAB_0014ff39;
      }
      if ((feature == NPOTTextures) || (feature == NPOTTextureRepeat)) {
        local_78 = (pair<int,_int>)QSurfaceFormat::version();
        local_80.first = 3;
        local_80.second = 0;
        bVar3 = std::operator>=(&local_78,&local_80);
        uVar2 = 1;
        if (!bVar3) {
          local_50.d._0_4_ = 0;
          local_50.d._4_4_ = 0;
          local_70.d = (Data *)0x0;
          local_70.ptr = (char *)0x0;
          local_50.ptr._0_4_ = 0x17c497;
          local_50.ptr._4_4_ = 0;
          local_70.size = 0;
          local_50.size._0_4_ = 0x13;
          local_50.size._4_4_ = 0;
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          uVar2 = 1;
          if (cVar1 == '\0') {
            local_98.d = (Data *)0x0;
            local_b0.d = (Data *)0x0;
            local_b0.ptr = (char *)0x0;
            local_98.ptr = "GL_ARB_texture_non_power_of_two";
            local_b0.size = 0;
            local_98.size = 0x1f;
            uVar2 = QOpenGLContext::hasExtension(pQVar4);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
          }
          goto LAB_0014ffcb;
        }
      }
      else if (feature == TextureComparisonOperators) {
        local_98.d = (Data *)QSurfaceFormat::version();
        local_b0.d = (Data *)0x3;
        bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
        uVar2 = 1;
        if (!bVar3) {
          local_50.ptr._0_4_ = 0x17c4ab;
          local_50.size._0_4_ = 0x16;
          goto LAB_0014ff39;
        }
      }
      else if (feature == ImmutableStorage) {
        local_98.d = (Data *)QSurfaceFormat::version();
        local_b0.d = (Data *)0x3;
        bVar3 = std::operator>=((pair<int,_int> *)&local_98,(pair<int,_int> *)&local_b0);
        if (!bVar3) {
          local_50.d._0_4_ = 0;
          local_50.d._4_4_ = 0;
          local_70.d = (Data *)0x0;
          local_70.ptr = (char *)0x0;
          local_50.ptr._0_4_ = 0x17c3c5;
          local_50.ptr._4_4_ = 0;
          local_70.size = 0;
          local_50.size._0_4_ = 0x16;
          local_50.size._4_4_ = 0;
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          if (cVar1 == '\0') {
            uVar2 = 0;
          }
          else {
            if (pcVar7 != (char *)0x0) goto LAB_0014ff91;
            uVar2 = 1;
          }
LAB_0014ffcb:
          QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
          goto LAB_0014ffda;
        }
        if (pcVar7 == (char *)0x0) {
          uVar2 = 1;
        }
        else {
LAB_0014ff91:
          pcVar7 = strstr(pcVar7,"Mali");
          uVar2 = pcVar7 == (char *)0x0;
          if (!bVar3) goto LAB_0014ffcb;
        }
      }
    }
  }
LAB_0014ffdf:
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
LAB_0014ffe9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool QOpenGLTexture::hasFeature(Feature feature)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::hasFeature() requires a valid current context");
        return false;
    }

    QSurfaceFormat f = ctx->format();

    bool supported = false;

#if !QT_CONFIG(opengles2)
    if (!ctx->isOpenGLES()) {
        switch (feature) {
        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage_multisample"));
            break;

        case TextureBuffer:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_buffer_object"));
            break;

        case StencilTexturing:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_stencil_texturing"));
            break;

        case ImmutableStorage:
            supported = f.version() >= std::pair(4, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage"));
            break;

        case TextureCubeMapArrays:
            supported = f.version() >= std::pair(4, 0)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_cube_map_array"));
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_swizzle"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_multisample"));
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_array"));
            break;

        case TextureRectangle:
            supported = f.version() >= std::pair(2, 1)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_rectangle"));
            break;

        case Texture3D:
            supported = f.version() >= std::pair(1, 3);
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            supported = f.version() >= std::pair(1, 1);
            break;

        case TextureComparisonOperators:
            // GL 1.4 and GL_ARB_shadow alone support only LEQUAL and GEQUAL;
            // since we're talking about history anyhow avoid to be extra pedantic
            // in the feature set, and simply claim supported if we have the full set of operators
            // (which has been added into 1.5 / GL_EXT_shadow_funcs).
            supported = f.version() >= std::pair(1, 5)
                    || (ctx->hasExtension(QByteArrayLiteral("GL_ARB_shadow"))
                        && ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_funcs")));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(1, 2);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    if (ctx->isOpenGLES())
#endif
    {
        const char *renderer = reinterpret_cast<const char *>(ctx->functions()->glGetString(GL_RENDERER));
        switch (feature) {
        case ImmutableStorage:
            supported = (f.version() >= std::pair(3, 0) || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage")))
                && !(renderer && strstr(renderer, "Mali")); // do not use on Mali: QTBUG-45106
            break;

        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureRectangle:
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0);
            break;

        case Texture3D:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_3D"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureBuffer:
            break;

        case TextureCubeMapArrays:
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 0);
            break;

        case StencilTexturing:
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = f.version() >= std::pair(3,0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_npot"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            break;

        case TextureComparisonOperators:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_samplers"));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(3, 0);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    return supported;
}